

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlabel.cpp
# Opt level: O0

void __thiscall QLabelPrivate::movieUpdated(QLabelPrivate *this,QRect *rect)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int ax;
  ulong uVar5;
  QRect *this_00;
  QLabelPrivate *in_RDI;
  long in_FS_OFFSET;
  QLabel *q;
  QRect pixmapRect;
  QRect cr;
  QRect r;
  QWidget *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff14;
  int in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff1c;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  QPixmap local_98 [24];
  QRect local_80;
  undefined1 local_70 [16];
  QPixmap local_60 [24];
  undefined8 local_48;
  QPoint local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 local_28 [16];
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  q_func(in_RDI);
  bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QMovie> *)0x5b272b);
  if (bVar1) {
    QPointer<QMovie>::operator->((QPointer<QMovie> *)0x5b2745);
    uVar5 = QMovie::isValid();
    if ((uVar5 & 1) != 0) {
      local_18._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_18._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QRect::QRect((QRect *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
      if ((*(ushort *)&in_RDI->field_0x340 >> 1 & 1) == 0) {
        this_00 = (QRect *)QWidget::style(in_stack_ffffffffffffff08);
        local_80 = QWidget::contentsRect
                             ((QWidget *)
                              CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
        in_stack_ffffffffffffff14 = in_RDI->align;
        QPointer<QMovie>::operator->((QPointer<QMovie> *)0x5b2986);
        QMovie::currentPixmap();
        local_70 = (**(code **)(*(long *)this_00 + 0x90))
                             (this_00,&local_80,in_stack_ffffffffffffff14,local_98);
        local_18 = local_70;
        QPixmap::~QPixmap(local_98);
        in_stack_ffffffffffffff18 = QRect::x((QRect *)0x5b29f2);
        QRect::y((QRect *)0x5b2a00);
        QRect::translate((QRect *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                         (int)((ulong)this_00 >> 0x20),(int)this_00);
        local_9c = QRect::width(this_00);
        local_a0 = QRect::width(this_00);
        qMin<int>(&local_9c,&local_a0);
        QRect::setWidth((QRect *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                        (int)((ulong)this_00 >> 0x20));
        local_a4 = QRect::height(this_00);
        local_a8 = QRect::height(this_00);
        iVar2 = (int)((ulong)this_00 >> 0x20);
        qMin<int>(&local_a4,&local_a8);
        QRect::setHeight((QRect *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                         iVar2);
      }
      else {
        local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_28._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_28 = (undefined1  [16])
                   QWidget::contentsRect
                             ((QWidget *)
                              CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
        local_38 = &DAT_aaaaaaaaaaaaaaaa;
        local_30 = &DAT_aaaaaaaaaaaaaaaa;
        local_40 = QRect::topLeft((QRect *)in_stack_ffffffffffffff08);
        QPointer<QMovie>::operator->((QPointer<QMovie> *)0x5b281c);
        QMovie::currentPixmap();
        local_48 = QPixmap::size();
        QRect::QRect((QRect *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                     (QPoint *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                     (QSize *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
        QPixmap::~QPixmap(local_60);
        bVar1 = QRect::isEmpty((QRect *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10
                                                ));
        if (bVar1) goto LAB_005b2a9f;
        iVar2 = QRect::left((QRect *)0x5b2890);
        QRect::top((QRect *)0x5b28a1);
        in_stack_ffffffffffffff1c = QRect::width((QRect *)in_stack_ffffffffffffff08);
        iVar3 = QRect::width((QRect *)in_stack_ffffffffffffff08);
        iVar3 = in_stack_ffffffffffffff1c * iVar3;
        iVar4 = QRect::width((QRect *)in_stack_ffffffffffffff08);
        iVar4 = iVar3 / iVar4;
        ax = QRect::height((QRect *)in_stack_ffffffffffffff08);
        QRect::height((QRect *)in_stack_ffffffffffffff08);
        QRect::height((QRect *)in_stack_ffffffffffffff08);
        QRect::setRect((QRect *)CONCAT44(iVar4,iVar2),ax,iVar3,in_stack_ffffffffffffff1c,
                       in_stack_ffffffffffffff18);
      }
      QWidget::update((QWidget *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                      (QRect *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
    }
  }
LAB_005b2a9f:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QLabelPrivate::movieUpdated(const QRect &rect)
{
    Q_Q(QLabel);
    if (movie && movie->isValid()) {
        QRect r;
        if (scaledcontents) {
            QRect cr = q->contentsRect();
            QRect pixmapRect(cr.topLeft(), movie->currentPixmap().size());
            if (pixmapRect.isEmpty())
                return;
            r.setRect(cr.left(), cr.top(),
                      (rect.width() * cr.width()) / pixmapRect.width(),
                      (rect.height() * cr.height()) / pixmapRect.height());
        } else {
            r = q->style()->itemPixmapRect(q->contentsRect(), align, movie->currentPixmap());
            r.translate(rect.x(), rect.y());
            r.setWidth(qMin(r.width(), rect.width()));
            r.setHeight(qMin(r.height(), rect.height()));
        }
        q->update(r);
    }
}